

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O0

void test_22(QPDF *pdf,char *arg2)

{
  ostream *this;
  QPDFPageObjectHelper local_d8;
  QPDFPageObjectHelper local_a0;
  reference local_68;
  QPDFPageObjectHelper *page;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> local_50 [8];
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> pages;
  undefined1 local_38 [8];
  QPDFPageDocumentHelper dh;
  char *arg2_local;
  QPDF *pdf_local;
  
  dh.m.super___shared_ptr<QPDFPageDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)arg2;
  QPDFPageDocumentHelper::QPDFPageDocumentHelper((QPDFPageDocumentHelper *)local_38,pdf);
  QPDFPageDocumentHelper::getAllPages();
  local_68 = std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::at
                       (local_50,0);
  QPDFPageObjectHelper::QPDFPageObjectHelper(&local_a0,local_68);
  QPDFPageDocumentHelper::removePage((QPDFPageObjectHelper *)local_38);
  QPDFPageObjectHelper::~QPDFPageObjectHelper(&local_a0);
  QPDFPageObjectHelper::QPDFPageObjectHelper(&local_d8,local_68);
  QPDFPageDocumentHelper::removePage((QPDFPageObjectHelper *)local_38);
  QPDFPageObjectHelper::~QPDFPageObjectHelper(&local_d8);
  this = std::operator<<((ostream *)&std::cout,"you can\'t see this");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector(local_50);
  QPDFPageDocumentHelper::~QPDFPageDocumentHelper((QPDFPageDocumentHelper *)local_38);
  return;
}

Assistant:

static void
test_22(QPDF& pdf, char const* arg2)
{
    // Try to remove a page we don't have
    QPDFPageDocumentHelper dh(pdf);
    std::vector<QPDFPageObjectHelper> pages = dh.getAllPages();
    QPDFPageObjectHelper& page = pages.at(0);
    dh.removePage(page);
    dh.removePage(page);
    std::cout << "you can't see this" << std::endl;
}